

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quic_circular_deque.h
# Opt level: O3

void __thiscall
quic::
QuicCircularDeque<quic::BandwidthSampler::AckPoint,3ul,std::allocator<quic::BandwidthSampler::AckPoint>>
::
AssignRange<quic::QuicCircularDeque<quic::BandwidthSampler::AckPoint,3ul,std::allocator<quic::BandwidthSampler::AckPoint>>::basic_iterator<quic::BandwidthSampler::AckPoint_const>,void>
          (QuicCircularDeque<quic::BandwidthSampler::AckPoint,3ul,std::allocator<quic::BandwidthSampler::AckPoint>>
           *this,basic_iterator<const_quic::BandwidthSampler::AckPoint> first,
          basic_iterator<const_quic::BandwidthSampler::AckPoint> last)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  QuicCircularDeque<quic::BandwidthSampler::AckPoint,_3UL,_std::allocator<quic::BandwidthSampler::AckPoint>_>
  *pQVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar6 = last.index_;
  uVar2 = first.index_;
  pQVar4 = first.deque_;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  uVar1 = (last.deque_)->begin_;
  uVar5 = uVar6;
  if (uVar6 < uVar1) {
    uVar5 = ((last.deque_)->allocator_and_data_).data_capacity + uVar6;
  }
  uVar3 = uVar2;
  if (uVar2 < pQVar4->begin_) {
    uVar3 = (pQVar4->allocator_and_data_).data_capacity + uVar2;
  }
  uVar5 = (uVar5 + pQVar4->begin_) - (uVar1 + uVar3);
  uVar1 = 0;
  if (*(long *)(this + 0x18) != 0) {
    uVar1 = *(long *)(this + 0x18) - 1;
  }
  if (uVar1 < uVar5) {
    QuicCircularDeque<quic::BandwidthSampler::AckPoint,_3UL,_std::allocator<quic::BandwidthSampler::AckPoint>_>
    ::Relocate((QuicCircularDeque<quic::BandwidthSampler::AckPoint,_3UL,_std::allocator<quic::BandwidthSampler::AckPoint>_>
                *)this,uVar5);
  }
  if (uVar2 != uVar6) {
    do {
      emplace_back<quic::BandwidthSampler::AckPoint_const&>
                (this,(pQVar4->allocator_and_data_).data + uVar2);
      bVar7 = (pQVar4->allocator_and_data_).data_capacity - 1 == uVar2;
      uVar2 = uVar2 + 1;
      if (bVar7) {
        uVar2 = 0;
      }
    } while (uVar2 != uVar6);
  }
  return;
}

Assistant:

void AssignRange(InputIt first, InputIt last) {
    ClearRetainCapacity();
    if (std::is_base_of<
            std::random_access_iterator_tag,
            typename std::iterator_traits<InputIt>::iterator_category>::value) {
      reserve(std::distance(first, last));
    }
    for (; first != last; ++first) {
      emplace_back(*first);
    }
  }